

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  vector<wabt::Type,_std::allocator<wabt::Type>_> *__x;
  bool bVar1;
  Result RVar2;
  TypeVector *prefix;
  _anonymous_namespace_ *this_00;
  bool bVar3;
  Label *label;
  Label *local_78;
  string local_70;
  string local_50;
  
  RVar2 = GetLabel(this,depth,&local_78);
  bVar3 = true;
  if (RVar2.enum_ != Error) {
    prefix = &local_78->param_types;
    this_00 = (_anonymous_namespace_ *)&local_78->result_types;
    if (local_78->label_type == Loop) {
      this_00 = (_anonymous_namespace_ *)prefix;
    }
    RVar2 = CheckSignature(this,(TypeVector *)this_00,"br_table");
    bVar3 = RVar2.enum_ == Error;
    __x = this->br_table_sig_;
    if (__x == (vector<wabt::Type,_std::allocator<wabt::Type>_> *)0x0) {
      this->br_table_sig_ = (TypeVector *)this_00;
    }
    else {
      if ((this->features_).reference_types_enabled_ == true) {
        if ((long)(__x->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(__x->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2 ==
            *(long *)(this_00 + 8) - *(long *)this_00 >> 2) goto LAB_00159367;
        PrintError(this,"br_table labels have inconsistent arity: expected %zd got %zd");
      }
      else {
        bVar1 = std::operator!=(__x,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)this_00);
        if (!bVar1) goto LAB_00159367;
        (anonymous_namespace)::TypesToString_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)this->br_table_sig_,(TypeVector *)0x0,
                   (char *)prefix);
        (anonymous_namespace)::TypesToString_abi_cxx11_
                  (&local_70,this_00,(TypeVector *)0x0,(char *)prefix);
        PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",
                   local_50._M_dataplus._M_p,local_70._M_dataplus._M_p);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
      bVar3 = true;
    }
  }
LAB_00159367:
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar3;
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  } else {
    if (features_.reference_types_enabled()) {
      if (br_table_sig_->size() != label_sig.size()) {
        result |= Result::Error;
        PrintError("br_table labels have inconsistent arity: expected %" PRIzd
                   " got %" PRIzd,
                   br_table_sig_->size(), label_sig.size());
      }
    } else {
      if (*br_table_sig_ != label_sig) {
        result |= Result::Error;
        PrintError(
            "br_table labels have inconsistent types: expected %s, got %s",
            TypesToString(*br_table_sig_).c_str(),
            TypesToString(label_sig).c_str());
      }
    }
  }

  return result;
}